

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# list_select.cpp
# Opt level: O2

void duckdb::ListSelectFunction<duckdb::SetSelectionVectorSelect>
               (DataChunk *args,ExpressionState *state,Vector *result)

{
  bool bVar1;
  reference this;
  reference this_00;
  Vector *pVVar2;
  idx_t iVar3;
  InvalidInputException *this_01;
  idx_t iVar4;
  idx_t iVar5;
  idx_t iVar6;
  idx_t i;
  idx_t iVar7;
  idx_t child_idx;
  allocator local_219;
  idx_t offset;
  Vector *local_210;
  Vector *local_208;
  TemplatedValidityMask<unsigned_long> *local_200;
  Vector *local_1f8;
  idx_t local_1f0;
  data_ptr_t local_1e8;
  DataChunk *local_1e0;
  Vector *local_1d8;
  data_ptr_t local_1d0;
  data_ptr_t local_1c8;
  long *local_1c0;
  idx_t local_1b8;
  ValidityMask *local_1b0;
  ValidityMask entry_validity_mask;
  SelectionVector result_selection_vec;
  UnifiedVectorFormat input_list;
  UnifiedVectorFormat selection_lists;
  Value local_d8;
  Vector local_98;
  
  this = vector<duckdb::Vector,_true>::get<true>(&args->data,0);
  this_00 = vector<duckdb::Vector,_true>::get<true>(&args->data,1);
  iVar4 = args->count;
  local_1c8 = result->data;
  local_1e0 = args;
  local_210 = ListVector::GetEntry(result);
  UnifiedVectorFormat::UnifiedVectorFormat(&selection_lists);
  Vector::ToUnifiedFormat(this_00,iVar4,&selection_lists);
  local_1e8 = selection_lists.data;
  local_208 = ListVector::GetEntry(this_00);
  UnifiedVectorFormat::UnifiedVectorFormat(&input_list);
  Vector::ToUnifiedFormat(this,iVar4,&input_list);
  local_1d0 = input_list.data;
  pVVar2 = ListVector::GetEntry(this);
  FlatVector::VerifyFlatVector(pVVar2);
  local_1b0 = &pVVar2->validity;
  iVar5 = 0;
  local_1f8 = pVVar2;
  for (iVar7 = 0; iVar4 != iVar7; iVar7 = iVar7 + 1) {
    iVar3 = iVar7;
    if ((input_list.sel)->sel_vector != (sel_t *)0x0) {
      iVar3 = (idx_t)(input_list.sel)->sel_vector[iVar7];
    }
    iVar6 = iVar7;
    if ((selection_lists.sel)->sel_vector != (sel_t *)0x0) {
      iVar6 = (idx_t)(selection_lists.sel)->sel_vector[iVar7];
    }
    if (((input_list.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
          (unsigned_long *)0x0) ||
        ((input_list.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask[iVar3 >> 6]
          >> (iVar3 & 0x3f) & 1) != 0)) &&
       ((selection_lists.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
         (unsigned_long *)0x0 ||
        ((selection_lists.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
          [iVar6 >> 6] >> (iVar6 & 0x3f) & 1) != 0)))) {
      Vector::Vector(&local_98,local_208);
      iVar5 = iVar5 + *(long *)(local_1e8 + iVar6 * 0x10 + 8);
      Vector::~Vector(&local_98);
    }
  }
  ListVector::Reserve(result,iVar5);
  SelectionVector::SelectionVector(&result_selection_vec,iVar5);
  pVVar2 = local_1f8;
  entry_validity_mask.super_TemplatedValidityMask<unsigned_long>.validity_mask =
       (unsigned_long *)0x0;
  entry_validity_mask.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
  super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)0x0;
  entry_validity_mask.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
  super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  entry_validity_mask.super_TemplatedValidityMask<unsigned_long>.capacity = iVar5;
  FlatVector::VerifyFlatVector(result);
  local_200 = &(result->validity).super_TemplatedValidityMask<unsigned_long>;
  offset = 0;
  iVar5 = 0;
  local_1f0 = iVar4;
  local_1d8 = result;
  do {
    if (iVar5 == iVar4) {
      Vector::Slice(local_210,pVVar2,&result_selection_vec,iVar4);
      Vector::Flatten(local_210,offset);
      ListVector::SetListSize(result,offset);
      FlatVector::SetValidity(local_210,&entry_validity_mask);
      bVar1 = DataChunk::AllConstant(local_1e0);
      Vector::SetVectorType(result,bVar1 * '\x02');
      ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&entry_validity_mask.super_TemplatedValidityMask<unsigned_long>.validity_data.
                  internal.
                  super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                  ._M_refcount);
      ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&result_selection_vec.selection_data.internal.
                  super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount)
      ;
      UnifiedVectorFormat::~UnifiedVectorFormat(&input_list);
      UnifiedVectorFormat::~UnifiedVectorFormat(&selection_lists);
      return;
    }
    iVar7 = iVar5;
    if ((selection_lists.sel)->sel_vector != (sel_t *)0x0) {
      iVar7 = (idx_t)(selection_lists.sel)->sel_vector[iVar5];
    }
    if ((selection_lists.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
         (unsigned_long *)0x0) ||
       ((selection_lists.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
         [iVar7 >> 6] >> (iVar7 & 0x3f) & 1) != 0)) {
      iVar4 = iVar5;
      if ((input_list.sel)->sel_vector != (sel_t *)0x0) {
        iVar4 = (idx_t)(input_list.sel)->sel_vector[iVar5];
      }
      iVar3 = *(idx_t *)(local_1e8 + iVar7 * 0x10);
      iVar7 = *(idx_t *)(local_1e8 + iVar7 * 0x10 + 8);
      if ((input_list.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
           (unsigned_long *)0x0) ||
         ((input_list.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask[iVar4 >> 6]
           >> (iVar4 & 0x3f) & 1) != 0)) {
        iVar6 = *(idx_t *)(local_1d0 + iVar4 * 0x10);
        iVar4 = *(idx_t *)(local_1d0 + iVar4 * 0x10 + 8);
        local_1c0 = (long *)(local_1c8 + iVar5 * 0x10);
        *(idx_t *)(local_1c8 + iVar5 * 0x10) = offset;
        local_1b8 = iVar5;
        for (child_idx = 0; iVar7 != child_idx; child_idx = child_idx + 1) {
          Vector::GetValue(&local_d8,local_208,iVar3 + child_idx);
          bVar1 = local_d8.is_null;
          Value::~Value(&local_d8);
          if (bVar1 == true) {
            this_01 = (InvalidInputException *)__cxa_allocate_exception(0x10);
            ::std::__cxx11::string::string
                      ((string *)&local_d8,
                       "NULLs are not allowed as list elements in the second input parameter.",
                       &local_219);
            InvalidInputException::InvalidInputException(this_01,(string *)&local_d8);
            __cxa_throw(this_01,&InvalidInputException::typeinfo,
                        ::std::runtime_error::~runtime_error);
          }
          SetSelectionVectorSelect::SetSelectionVector
                    (&result_selection_vec,&entry_validity_mask,local_1b0,local_208,child_idx,
                     &offset,iVar3,iVar6,iVar4);
        }
        local_1c0[1] = offset - *local_1c0;
        iVar4 = local_1f0;
        result = local_1d8;
        pVVar2 = local_1f8;
        iVar5 = local_1b8;
      }
      else {
        TemplatedValidityMask<unsigned_long>::SetInvalid(local_200,iVar5);
        iVar4 = local_1f0;
      }
    }
    else {
      TemplatedValidityMask<unsigned_long>::SetInvalid(local_200,iVar5);
    }
    iVar5 = iVar5 + 1;
  } while( true );
}

Assistant:

static void ListSelectFunction(DataChunk &args, ExpressionState &state, Vector &result) {
	D_ASSERT(args.data.size() == 2);
	Vector &list = args.data[0];
	Vector &selection_list = args.data[1];
	idx_t count = args.size();

	list_entry_t *result_data;
	result_data = FlatVector::GetData<list_entry_t>(result);
	auto &result_entry = ListVector::GetEntry(result);

	UnifiedVectorFormat selection_lists;
	selection_list.ToUnifiedFormat(count, selection_lists);
	auto selection_lists_data = UnifiedVectorFormat::GetData<list_entry_t>(selection_lists);
	auto &selection_entry = ListVector::GetEntry(selection_list);

	UnifiedVectorFormat input_list;
	list.ToUnifiedFormat(count, input_list);
	auto input_lists_data = UnifiedVectorFormat::GetData<list_entry_t>(input_list);
	auto &input_entry = ListVector::GetEntry(list);
	auto &input_validity = FlatVector::Validity(input_entry);

	idx_t result_length = 0;
	for (idx_t i = 0; i < count; i++) {
		idx_t input_idx = input_list.sel->get_index(i);
		idx_t selection_idx = selection_lists.sel->get_index(i);
		if (input_list.validity.RowIsValid(input_idx) && selection_lists.validity.RowIsValid(selection_idx)) {
			OP::GetResultLength(args, result_length, selection_lists_data, selection_entry, selection_idx);
		}
	}

	ListVector::Reserve(result, result_length);
	SelectionVector result_selection_vec = SelectionVector(result_length);
	ValidityMask entry_validity_mask = ValidityMask(result_length);
	ValidityMask &result_validity_mask = FlatVector::Validity(result);

	idx_t offset = 0;
	for (idx_t j = 0; j < count; j++) {
		// Get length and offset of selection list for current output row
		auto selection_list_idx = selection_lists.sel->get_index(j);
		idx_t selection_len = 0;
		idx_t selection_offset = 0;
		if (selection_lists.validity.RowIsValid(selection_list_idx)) {
			selection_len = selection_lists_data[selection_list_idx].length;
			selection_offset = selection_lists_data[selection_list_idx].offset;
		} else {
			result_validity_mask.SetInvalid(j);
			continue;
		}
		// Get length and offset of input list for current output row
		auto input_list_idx = input_list.sel->get_index(j);
		idx_t input_length = 0;
		idx_t input_offset = 0;
		if (input_list.validity.RowIsValid(input_list_idx)) {
			input_length = input_lists_data[input_list_idx].length;
			input_offset = input_lists_data[input_list_idx].offset;
		} else {
			result_validity_mask.SetInvalid(j);
			continue;
		}
		result_data[j].offset = offset;
		// Set all selected values in the result
		for (idx_t child_idx = 0; child_idx < selection_len; child_idx++) {
			if (selection_entry.GetValue(selection_offset + child_idx).IsNull()) {
				throw InvalidInputException("NULLs are not allowed as list elements in the second input parameter.");
			}
			OP::SetSelectionVector(result_selection_vec, entry_validity_mask, input_validity, selection_entry,
			                       child_idx, offset, selection_offset, input_offset, input_length);
		}
		result_data[j].length = offset - result_data[j].offset;
	}
	result_entry.Slice(input_entry, result_selection_vec, count);
	result_entry.Flatten(offset);
	ListVector::SetListSize(result, offset);
	FlatVector::SetValidity(result_entry, entry_validity_mask);
	result.SetVectorType(args.AllConstant() ? VectorType::CONSTANT_VECTOR : VectorType::FLAT_VECTOR);
}